

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

ImVec2 InputTextCalcTextSizeW
                 (ImWchar *text_begin,ImWchar *text_end,ImWchar **remaining,ImVec2 *out_offset,
                 bool stop_on_new_line)

{
  float fVar1;
  float fVar2;
  ImWchar c;
  ImFont *this;
  float fVar3;
  ImVec2 IVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  
  this = GImGui->Font;
  fVar1 = GImGui->FontSize;
  fVar2 = this->FontSize;
  fVar5 = 0.0;
  fVar6 = 0.0;
  do {
    fVar7 = 0.0;
    while( true ) {
      do {
        if (text_end <= text_begin) goto LAB_0018d85d;
        c = *text_begin;
        text_begin = text_begin + 1;
      } while (c == 0xd);
      if (c == 10) break;
      fVar3 = ImFont::GetCharAdvance(this,c);
      fVar7 = fVar7 + fVar3 * (fVar1 / fVar2);
    }
    fVar5 = (float)(~-(uint)(fVar7 <= fVar5) & (uint)fVar7 | -(uint)(fVar7 <= fVar5) & (uint)fVar5);
    fVar6 = fVar6 + fVar1;
  } while ((char)out_offset == '\0');
  fVar7 = 0.0;
LAB_0018d85d:
  if (remaining != (ImWchar **)0x0) {
    *remaining = text_begin;
  }
  if (fVar5 < fVar7) {
    fVar5 = fVar7;
  }
  if (fVar6 == 0.0 || 0.0 < fVar7) {
    fVar6 = fVar1 + fVar6;
  }
  IVar4.y = fVar6;
  IVar4.x = fVar5;
  return IVar4;
}

Assistant:

static ImVec2 InputTextCalcTextSizeW(const ImWchar* text_begin, const ImWchar* text_end, const ImWchar** remaining, ImVec2* out_offset, bool stop_on_new_line)
{
    ImGuiContext& g = *GImGui;
    ImFont* font = g.Font;
    const float line_height = g.FontSize;
    const float scale = line_height / font->FontSize;

    ImVec2 text_size = ImVec2(0, 0);
    float line_width = 0.0f;

    const ImWchar* s = text_begin;
    while (s < text_end)
    {
        unsigned int c = (unsigned int)(*s++);
        if (c == '\n')
        {
            text_size.x = ImMax(text_size.x, line_width);
            text_size.y += line_height;
            line_width = 0.0f;
            if (stop_on_new_line)
                break;
            continue;
        }
        if (c == '\r')
            continue;

        const float char_width = font->GetCharAdvance((ImWchar)c) * scale;
        line_width += char_width;
    }

    if (text_size.x < line_width)
        text_size.x = line_width;

    if (out_offset)
        *out_offset = ImVec2(line_width, text_size.y + line_height);  // offset allow for the possibility of sitting after a trailing \n

    if (line_width > 0 || text_size.y == 0.0f)                        // whereas size.y will ignore the trailing \n
        text_size.y += line_height;

    if (remaining)
        *remaining = s;

    return text_size;
}